

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCopyDatabase::Deserialize(LogicalCopyDatabase *this,Deserializer *deserializer)

{
  LogicalCopyDatabase *this_00;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_20;
  ParseInfo *local_18;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe8,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalCopyDatabase *)operator_new(0x70);
  local_20._M_head_impl = local_18;
  local_18 = (ParseInfo *)0x0;
  LogicalCopyDatabase(this_00,(unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
                               *)&local_20);
  if (local_20._M_head_impl != (ParseInfo *)0x0) {
    (*(local_20._M_head_impl)->_vptr_ParseInfo[1])();
  }
  local_20._M_head_impl = (ParseInfo *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_18 != (ParseInfo *)0x0) {
    (**(code **)(*(_func_int **)local_18 + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCopyDatabase::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalCopyDatabase>(new LogicalCopyDatabase(std::move(info)));
	return std::move(result);
}